

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fctkern__cl_parse(fctkern_t *nk)

{
  fct_clp_t *clp_00;
  char **ppcVar1;
  size_t sVar2;
  fctcl_t *clo;
  undefined8 *puVar3;
  fct_logger_types_t *pfVar4;
  bool bVar5;
  FILE *__stream;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *option;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  fct_logger_i *itm;
  long lVar13;
  char *s;
  ulong uVar14;
  fct_clp_t *clp;
  char *err;
  int local_80;
  fct_logger_types_t *local_48 [3];
  
  iVar7 = 0;
  if ((nk != (fctkern_t *)0x0) &&
     ((iVar7 = 0, nk->cl_user_opts == (fctcl_init_t *)0x0 ||
      (iVar6 = fct_clp__add_options(&nk->cl_parser,nk->cl_user_opts), iVar6 != 0)))) {
    clp_00 = &nk->cl_parser;
    iVar6 = fct_clp__add_options(clp_00,FCT_CLP_OPTIONS);
    if (iVar6 != 0) {
      iVar7 = nk->cl_argc;
      ppcVar1 = nk->cl_argv;
      pcVar12 = (nk->cl_parser).error_msg;
      (nk->cl_parser).error_msg[0] = '\0';
      (nk->cl_parser).is_error = 0;
      if (1 < iVar7) {
        local_80 = 1;
        do {
          pcVar8 = fctstr_clone(ppcVar1[local_80]);
          option = strtok(pcVar8,"=");
          pcVar9 = strtok((char *)0x0,"=");
          sVar2 = (nk->cl_parser).clo_list.used_itm_num;
          if (sVar2 == 0) {
            bVar5 = true;
          }
          else {
            bVar5 = false;
            uVar14 = 0;
            do {
              if ((nk->cl_parser).clo_list.used_itm_num <= uVar14) goto LAB_001026df;
              clo = (fctcl_t *)(clp_00->clo_list).itm_list[uVar14];
              pcVar10 = option;
              iVar6 = fctcl__is_option(clo,option);
              if (iVar6 != 0) {
                bVar5 = true;
                if (clo->action == FCTCL_STORE_TRUE) {
                  s = "1";
                }
                else {
                  if (clo->action != FCTCL_STORE_VALUE) goto LAB_00102350;
                  if ((pcVar9 == (char *)0x0) || (s = pcVar9, *pcVar9 == '\0')) {
                    local_80 = local_80 + 1;
                    if (iVar7 <= local_80) {
                      fct_snprintf(pcVar12,(size_t)pcVar10,"missing argument for %s",option);
                      (nk->cl_parser).is_error = 1;
                      goto LAB_00102350;
                    }
                    s = ppcVar1[local_80];
                  }
                }
                pcVar10 = fctstr_clone(s);
                clo->value = pcVar10;
              }
LAB_00102350:
            } while ((sVar2 - 1 != uVar14) && (uVar14 = uVar14 + 1, iVar6 == 0));
            bVar5 = !bVar5;
          }
          if ((nk->cl_parser).is_error != 0) break;
          if (bVar5) {
            fct_nlist__append(&(nk->cl_parser).param_list,pcVar8);
            pcVar8 = (char *)0x0;
          }
          if (pcVar8 != (char *)0x0) {
            free(pcVar8);
          }
          local_80 = local_80 + 1;
        } while (local_80 < iVar7);
      }
      if ((nk->cl_parser).is_error == 0) {
        sVar2 = (nk->cl_parser).param_list.used_itm_num;
        if (sVar2 != 0) {
          uVar14 = 0;
          do {
            if ((nk->cl_parser).param_list.used_itm_num <= uVar14) goto LAB_001026df;
            pcVar12 = (char *)(nk->cl_parser).param_list.itm_list[uVar14];
            if (pcVar12 == (char *)0x0) {
              __assert_fail("prefix_filter != ((void*)0) && \"invalid arg\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                            ,0x7de,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
            }
            sVar11 = strlen(pcVar12);
            if (sVar11 == 0) {
              __assert_fail("strlen(prefix_filter) > 0 && \"invalid arg\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                            ,0x7df,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
            }
            pcVar8 = (char *)malloc(sVar11 + 1);
            fctstr_safe_cpy(pcVar8,pcVar12,sVar11 + 1);
            fct_nlist__append(&nk->prefix_list,pcVar8);
            uVar14 = uVar14 + 1;
          } while (sVar2 != uVar14);
        }
        pcVar12 = fct_clp__optval2(clp_00,"--version",(char *)0x0);
        if (pcVar12 == (char *)0x0) {
          pcVar12 = fct_clp__optval2(clp_00,"--help",(char *)0x0);
          __stream = _stdout;
          if (pcVar12 == (char *)0x0) {
            pcVar12 = fct_clp__optval2(clp_00,"--logger","standard");
            if (pcVar12 == (char *)0x0) {
              __assert_fail("sel_logger != ((void*)0) && \"should never be NULL\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                            ,0x82f,"int fctkern__cl_parse_config_logger(fctkern_t *)");
            }
            if (nk->lt_usr == (fct_logger_types_t *)0x0) {
              itm = (fct_logger_i *)0x0;
            }
            else {
              itm = fckern_sel_log(nk->lt_usr,pcVar12);
            }
            if (itm == (fct_logger_i *)0x0 && nk->lt_sys != (fct_logger_types_t *)0x0) {
              itm = fckern_sel_log(nk->lt_sys,pcVar12);
            }
            if (itm != (fct_logger_i *)0x0) {
              fct_nlist__append(&nk->logger_list,itm);
              nk->cl_is_parsed = 1;
              return 1;
            }
            fprintf(_stderr,"error: unknown logger selected - \'%s\'",pcVar12);
          }
          else {
            fwrite("test.exe [options] prefix_filter ...\n\n",0x26,1,_stdout);
            sVar2 = (nk->cl_parser).clo_list.used_itm_num;
            if (sVar2 != 0) {
              uVar14 = 0;
              do {
                if ((nk->cl_parser).clo_list.used_itm_num <= uVar14) {
LAB_001026df:
                  __assert_fail("idx < list->used_itm_num",
                                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                                ,0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
                }
                puVar3 = (undefined8 *)(clp_00->clo_list).itm_list[uVar14];
                if (puVar3[1] == 0) {
                  fprintf(__stream,"%s\n",*puVar3);
                }
                else {
                  fprintf(__stream,"%s, %s\n");
                }
                iVar7 = fctstr_ieq((char *)*puVar3,"--logger");
                if (iVar7 == 0) {
                  pcVar12 = (char *)puVar3[3];
                  pcVar8 = "  %s\n";
                }
                else {
                  local_48[0] = nk->lt_sys;
                  local_48[1] = nk->lt_usr;
                  fputs("  Sets the logger. The types of loggers currently available are,\n",
                        __stream);
                  lVar13 = 0;
                  do {
                    pfVar4 = local_48[lVar13];
                    if (pfVar4 != (fct_logger_types_t *)0x0) {
                      pcVar12 = pfVar4->name;
                      while (pcVar12 != (char *)0x0) {
                        fprintf(__stream,"   =%s : %s\n",pcVar12,pfVar4->desc);
                        pcVar12 = pfVar4[1].name;
                        pfVar4 = pfVar4 + 1;
                      }
                    }
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 2);
                  pcVar8 = "  default is \'%s\'.\n";
                  pcVar12 = "standard";
                }
                fprintf(__stream,pcVar8,pcVar12);
                uVar14 = uVar14 + 1;
              } while (uVar14 != sVar2);
            }
            fputs("\n",__stream);
          }
        }
        else {
          printf("Built using FCTX version %s.\n","1.6.1");
        }
        iVar7 = -1;
      }
      else {
        iVar7 = 0;
        fprintf(_stderr,"error: %s",pcVar12);
      }
    }
  }
  return iVar7;
}

Assistant:

static int
fctkern__cl_parse(fctkern_t *nk)
{
    int status =0;
    size_t num_params =0;
    size_t param_i =0;
    if ( nk == NULL )
    {
        return 0;
    }
    if ( nk->cl_user_opts != NULL )
    {
        if ( !fct_clp__add_options(&(nk->cl_parser), nk->cl_user_opts) )
        {
            status =0;
            goto finally;
        }
    }
    /* You want to add the "house options" after the user defined ones. The
    options are stored as a list so it means that any option listed after
    the above ones won't get parsed. */
    if ( !fct_clp__add_options(&(nk->cl_parser), FCT_CLP_OPTIONS) )
    {
        status =0;
        goto finally;
    }
    fct_clp__parse(&(nk->cl_parser), nk->cl_argc, nk->cl_argv);
    if ( fct_clp__is_error(&(nk->cl_parser)) )
    {
        char *err = fct_clp__get_error(&(nk->cl_parser));
        fprintf(stderr, "error: %s", err);
        status =0;
        goto finally;
    }
    num_params = fct_clp__param_cnt(&(nk->cl_parser));
    for ( param_i =0; param_i != num_params; ++param_i )
    {
        char const *param = fct_clp__param_at(&(nk->cl_parser), param_i);
        fctkern__add_prefix_filter(nk, param);
    }
    if ( fctkern__cl_is(nk, FCT_OPT_VERSION) )
    {
        (void)printf("Built using FCTX version %s.\n", FCT_VERSION_STR);
        status = -1;
        goto finally;
    }
    if ( fctkern__cl_is(nk, FCT_OPT_HELP) )
    {
        fctkern__write_help(nk, stdout);
        status = -1;
        goto finally;
    }
    if ( !fctkern__cl_parse_config_logger(nk) )
    {
        status = -1;
        goto finally;
    }
    status =1;
    nk->cl_is_parsed =1;
finally:
    return status;
}